

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

void Js::JavascriptLibrary::AddWeakSetElementInflate_TTD(JavascriptWeakSet *set,Var value)

{
  Var this;
  ScriptContext *pSVar1;
  BaseHashSet<Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::RecyclableObject_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *this_00;
  DynamicObject *key;
  DynamicObject *local_20;
  Var local_18;
  Var value_local;
  JavascriptWeakSet *set_local;
  
  local_18 = value;
  value_local = set;
  pSVar1 = RecyclableObject::GetScriptContext((RecyclableObject *)set);
  this_00 = Memory::
            RecyclerRootPtr<JsUtil::BaseHashSet<Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::RecyclableObject_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
            ::operator->(&pSVar1->TTDContextInfo->TTDWeakReferencePinSet);
  local_20 = VarTo<Js::DynamicObject>(local_18);
  JsUtil::
  BaseHashSet<Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::RecyclableObject_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::Add(this_00,(RecyclableObject **)&local_20);
  this = value_local;
  key = VarTo<Js::DynamicObject>(local_18);
  JavascriptWeakSet::Add((JavascriptWeakSet *)this,&key->super_RecyclableObject);
  return;
}

Assistant:

void JavascriptLibrary::AddWeakSetElementInflate_TTD(Js::JavascriptWeakSet* set, Var value)
    {
        set->GetScriptContext()->TTDContextInfo->TTDWeakReferencePinSet->Add(Js::VarTo<Js::DynamicObject>(value));

        set->Add(Js::VarTo<Js::DynamicObject>(value));
    }